

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O3

void negation_verify::NegationVerifyT<long>(void)

{
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void NegationVerifyT()
    {
        T minInt = std::numeric_limits<T>::min();
        T test = 2;
        bool result = false;
        T out = 0;

        try
        {
            out = -SafeInt< T >(minInt);
        }
        catch (...)
        {
            result = true;
        }

        if (result == false)
            std::cerr << "Error in NegationVerifyT throw (1): " << std::endl;

        try
        {
            out = -SafeInt< T >(test);
        }
        catch (...)
        {
            result = false;
        }

        if (result == false)
            std::cerr << "Error in NegationVerifyT throw (2): " << std::endl;

        // Now try the non-throwing version

        result = SafeNegation(minInt, out);

        if (result != false)
            std::cerr << "Error in NegationVerifyT nothrow (1): " << std::endl;

        result = SafeNegation(test, out);

        if (result == false)
            std::cerr << "Error in NegationVerifyT nothrow (2): " << std::endl;
    }